

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

void __thiscall GetAllUsersRequest::GetAllUsersRequest(GetAllUsersRequest *this,Event *e)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  keysToBeInEvent;
  bool bVar1;
  EventNotValid *this_00;
  string *local_c0;
  allocator local_99;
  string local_98 [35];
  undefined1 local_75;
  allocator local_61;
  string *local_60;
  string local_58 [32];
  iterator local_38;
  undefined8 local_30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_28;
  Event *local_18;
  Event *e_local;
  GetAllUsersRequest *this_local;
  
  local_18 = e;
  e_local = (Event *)this;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&local_28,e);
  local_75 = 1;
  local_60 = local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"type",&local_61);
  local_75 = 0;
  local_38 = (iterator)local_58;
  local_30 = 1;
  keysToBeInEvent._M_len = 1;
  keysToBeInEvent._M_array = local_38;
  bVar1 = checkEventKeys(&local_28,keysToBeInEvent);
  local_c0 = (string *)&local_38;
  do {
    local_c0 = local_c0 + -0x20;
    std::__cxx11::string::~string(local_c0);
  } while (local_c0 != local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_28);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  this_00 = (EventNotValid *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"Improper GET_ALL_USERS_REQUEST",&local_99);
  EventNotValid::EventNotValid(this_00,(string *)local_98);
  __cxa_throw(this_00,&EventNotValid::typeinfo,EventNotValid::~EventNotValid);
}

Assistant:

explicit GetAllUsersRequest(Event e){
	  if(!checkEventKeys(e, {"type"})) {
		  throw EventNotValid("Improper GET_ALL_USERS_REQUEST");
	  }
  }